

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m256v_add_inplace(m256v *A,m256v *B_inout)

{
  int iVar1;
  size_t sVar2;
  uint8_t *puVar3;
  long lVar4;
  uint8_t *puVar5;
  long lVar6;
  
  if (0 < B_inout->n_row) {
    lVar4 = 0;
    do {
      puVar5 = A->e + A->rstride * lVar4;
      iVar1 = A->n_col;
      if (puVar5 < puVar5 + iVar1) {
        sVar2 = B_inout->rstride;
        puVar3 = B_inout->e;
        lVar6 = 0;
        do {
          puVar3[lVar6 + sVar2 * lVar4] = puVar3[lVar6 + sVar2 * lVar4] ^ puVar5[lVar6];
          lVar6 = lVar6 + 1;
        } while (iVar1 != lVar6);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < B_inout->n_row);
  }
  return;
}

Assistant:

void MV_GEN_N(_add_inplace)(const MV_GEN_TYPE* A, MV_GEN_TYPE* B_inout)
{
	assert(A->n_row == B_inout->n_row);
	assert(A->n_col == B_inout->n_col);

	for (int r = 0; r < B_inout->n_row; ++r) {
		MV_GEN_N(_multadd_row)(A, r, 1, B_inout, r);
	}
}